

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentationFormatter.cxx
# Opt level: O3

void __thiscall
cmDocumentationFormatter::PrintPreformatted(cmDocumentationFormatter *this,ostream *os,char *text)

{
  char *__s;
  char cVar1;
  undefined8 in_RAX;
  size_t sVar2;
  byte bVar3;
  undefined8 uStack_38;
  
  cVar1 = *text;
  uStack_38 = in_RAX;
  if (cVar1 != '\0') {
    bVar3 = 1;
    do {
      if (!(bool)(~bVar3 & 1 | cVar1 == '\n')) {
        __s = this->TextIndent;
        if (__s == (char *)0x0) {
          std::ios::clear((int)os + (int)os->_vptr_basic_ostream[-3]);
        }
        else {
          sVar2 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar2);
        }
        bVar3 = 0;
      }
      uStack_38 = CONCAT17(*text,(undefined7)uStack_38);
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)((long)&uStack_38 + 7),1);
      cVar1 = text[1];
      bVar3 = *text == '\n' | bVar3;
      text = text + 1;
    } while (cVar1 != '\0');
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  return;
}

Assistant:

void cmDocumentationFormatter::PrintPreformatted(std::ostream& os,
                                                 const char* text)
{
  bool newline = true;
  for (const char* ptr = text; *ptr; ++ptr) {
    if (newline && *ptr != '\n') {
      os << this->TextIndent;
      newline = false;
    }
    os << *ptr;
    if (*ptr == '\n') {
      newline = true;
    }
  }
  os << "\n";
}